

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildCommand.cxx
# Opt level: O0

void __thiscall cmCTestBuildCommand::~cmCTestBuildCommand(cmCTestBuildCommand *this)

{
  cmCTestBuildCommand *this_local;
  
  ~cmCTestBuildCommand(this);
  operator_delete(this,0x248);
  return;
}

Assistant:

cmCTestBuildCommand::~cmCTestBuildCommand() = default;